

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

bool __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::insert_media
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false> *this,Media *media)

{
  DiskIICard *this_00;
  SCSICard *this_01;
  
  if ((media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = diskii_card(this);
    if (this_00 != (DiskIICard *)0x0) {
      DiskIICard::set_disk
                (this_00,(media->disks).
                         super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,0);
    }
  }
  if ((media->mass_storage_devices).
      super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (media->mass_storage_devices).
      super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = scsi_card(this);
    if (this_01 != (SCSICard *)0x0) {
      SCSICard::set_storage_device
                (this_01,(media->mass_storage_devices).
                         super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.disks.empty()) {
				auto diskii = diskii_card();
				if(diskii) diskii->set_disk(media.disks[0], 0);
			}

			if(!media.mass_storage_devices.empty()) {
				auto scsi = scsi_card();
				if(scsi) scsi->set_storage_device(media.mass_storage_devices[0]);
			}

			return true;
		}